

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O1

void __thiscall wasm::BinaryInstWriter::visitTryTable(BinaryInstWriter *this,TryTable *curr)

{
  pointer *ppNVar1;
  Name *pNVar2;
  BufferWithRandomAccess *pBVar3;
  iterator __position;
  bool bVar4;
  undefined8 uVar5;
  BinaryInstWriter *pBVar6;
  size_t in_RCX;
  char *__function;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  BufferWithRandomAccess *__args;
  ulong uVar7;
  ulong uVar8;
  Name name;
  Name name_00;
  LEB<unsigned_int,_unsigned_char> local_4c;
  LEB<unsigned_int,_unsigned_char> local_48;
  LEB<unsigned_int,_unsigned_char> local_44;
  BinaryInstWriter *local_40;
  uchar local_33;
  byte local_32;
  uchar local_31;
  
  local_33 = '\x1f';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_33);
  emitResultType(this,(Type)(curr->super_SpecificExpression<(wasm::Expression::Id)53>).
                            super_Expression.type.id);
  local_4c.value =
       (uint)(curr->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
             usedElements;
  local_40 = this;
  LEB<unsigned_int,_unsigned_char>::write(&local_4c,(int)this->o,__buf,in_RCX);
  if ((curr->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements != 0
     ) {
    uVar7 = 0;
    uVar8 = 1;
    do {
      pBVar6 = local_40;
      if ((curr->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data[uVar7].
          super_IString.str._M_str != (char *)0x0) {
        if (uVar7 < (curr->catchRefs).super_ArenaVectorBase<ArenaVector<bool>,_bool>.usedElements) {
          local_31 = (curr->catchRefs).super_ArenaVectorBase<ArenaVector<bool>,_bool>.data[uVar7];
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    (&local_40->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                     &local_31);
          if (uVar7 < (curr->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
                      usedElements) {
            __args = pBVar6->o;
            pNVar2 = (curr->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
                     data;
            name.super_IString.str._M_str = pNVar2[uVar7].super_IString.str._M_str;
            name.super_IString.str._M_len = pNVar2[uVar7].super_IString.str._M_len;
            local_44.value = WasmBinaryWriter::getTagIndex(pBVar6->parent,name);
            LEB<unsigned_int,_unsigned_char>::write(&local_44,(int)__args,__buf_00,in_RCX);
            goto LAB_00caed70;
          }
LAB_00caede9:
          __function = 
          "T &ArenaVectorBase<ArenaVector<wasm::Name>, wasm::Name>::operator[](size_t) const [SubType = ArenaVector<wasm::Name>, T = wasm::Name]"
          ;
          goto LAB_00caee15;
        }
LAB_00caee00:
        __function = 
        "T &ArenaVectorBase<ArenaVector<bool>, bool>::operator[](size_t) const [SubType = ArenaVector<bool>, T = bool]"
        ;
LAB_00caee15:
        __assert_fail("index < usedElements",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                      ,0xbc,__function);
      }
      if ((curr->catchRefs).super_ArenaVectorBase<ArenaVector<bool>,_bool>.usedElements <= uVar7)
      goto LAB_00caee00;
      local_32 = (curr->catchRefs).super_ArenaVectorBase<ArenaVector<bool>,_bool>.data[uVar7] | 2;
      __args = (BufferWithRandomAccess *)&local_32;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&local_40->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                 (uchar *)__args);
LAB_00caed70:
      if ((curr->catchDests).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements
          <= uVar7) goto LAB_00caede9;
      pBVar3 = local_40->o;
      name_00.super_IString.str._M_str =
           (curr->catchDests).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data[uVar7]
           .super_IString.str._M_str;
      name_00.super_IString.str._M_len = (size_t)__args;
      local_48.value = getBreakIndex(local_40,name_00);
      LEB<unsigned_int,_unsigned_char>::write(&local_48,(int)pBVar3,__buf_01,in_RCX);
      bVar4 = uVar8 < (curr->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
                      usedElements;
      uVar7 = uVar8;
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (bVar4);
  }
  uVar5 = IMPOSSIBLE_CONTINUE._8_8_;
  __position._M_current =
       (local_40->breakStack).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (local_40->breakStack).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<wasm::Name,std::allocator<wasm::Name>>::_M_realloc_insert<wasm::Name&>
              ((vector<wasm::Name,std::allocator<wasm::Name>> *)&local_40->breakStack,__position,
               (Name *)IMPOSSIBLE_CONTINUE);
  }
  else {
    ((__position._M_current)->super_IString).str._M_len = IMPOSSIBLE_CONTINUE._0_8_;
    ((__position._M_current)->super_IString).str._M_str = (char *)uVar5;
    ppNVar1 = &(local_40->breakStack).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppNVar1 = *ppNVar1 + 1;
  }
  return;
}

Assistant:

void BinaryInstWriter::visitTryTable(TryTable* curr) {
  o << int8_t(BinaryConsts::TryTable);
  emitResultType(curr->type);
  o << U32LEB(curr->catchTags.size());
  for (Index i = 0; i < curr->catchTags.size(); i++) {
    if (curr->catchTags[i]) {
      o << (curr->catchRefs[i] ? int8_t(BinaryConsts::CatchRef)
                               : int8_t(BinaryConsts::Catch));
      o << U32LEB(parent.getTagIndex(curr->catchTags[i]));
    } else {
      o << (curr->catchRefs[i] ? int8_t(BinaryConsts::CatchAllRef)
                               : int8_t(BinaryConsts::CatchAll));
    }
    o << U32LEB(getBreakIndex(curr->catchDests[i]));
  }
  // the binary format requires this; we have a block if we need one
  // catch_*** clauses should refer to block labels without entering the try
  // scope. So we do this at the end.
  breakStack.emplace_back(IMPOSSIBLE_CONTINUE);
}